

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubsetTests.cpp
# Opt level: O2

void __thiscall IsIterableNotContainingSubsetTests::Run(IsIterableNotContainingSubsetTests *this)

{
  allocator local_189;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  std::__cxx11::string::string(local_e8,"a vector containing the passed int is not true",&local_189)
  ;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/Iterable/Containing/SubsetTests.cpp:52:58)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/Iterable/Containing/SubsetTests.cpp:52:58)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])(this,local_e8)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::string
            (local_108,"a vector containing an equivalent set of the passed set is not true",
             &local_189);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/Iterable/Containing/SubsetTests.cpp:56:79)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/Iterable/Containing/SubsetTests.cpp:56:79)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_108);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::string
            (local_128,"a vector not containing the passed int is not false",&local_189);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/Iterable/Containing/SubsetTests.cpp:60:63)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/Iterable/Containing/SubsetTests.cpp:60:63)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_128);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::string
            (local_148,"a vector containing a subset of the passed set is not false",&local_189);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/Iterable/Containing/SubsetTests.cpp:64:71)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/Iterable/Containing/SubsetTests.cpp:64:71)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_148);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::string
            (local_168,"Is::Iterable::Containing::Subset() is an operand",&local_189);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/Iterable/Containing/SubsetTests.cpp:68:60)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/Iterable/Containing/SubsetTests.cpp:68:60)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_168);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::string
            (local_188,"Is::Iterable::Containing::Subset() has an error message",&local_189);
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/Iterable/Containing/SubsetTests.cpp:72:67)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/Iterable/Containing/SubsetTests.cpp:72:67)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_188);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  std::__cxx11::string::~string(local_188);
  return;
}

Assistant:

virtual void Run()
	{
		Then("a vector containing the passed int is not true", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(std::vector<int>({4,2}))(std::vector<int>({1,2,3,4,5})), ut11::Is::Not::True);
		});

		Then("a vector containing an equivalent set of the passed set is not true", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(std::vector<int>({1,2,3,4,5}))(std::vector<int>({1,2,3,4,5})), ut11::Is::Not::True);
		});

		Then("a vector not containing the passed int is not false", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(std::vector<int>({4,8}))(std::vector<int>({1,2,3,4,5})), ut11::Is::Not::False);
		});

		Then("a vector containing a subset of the passed set is not false", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(std::vector<int>({1,2,3,4,5,6}))(std::vector<int>({1,2,3,4,5})), ut11::Is::Not::False);
		});

		Then("Is::Iterable::Containing::Subset() is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Iterable::Not::Containing::Subset(5)) >::value, ut11::Is::True);
		});

		Then("Is::Iterable::Containing::Subset() has an error message", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Subset(5).GetErrorMessage(std::vector<int>()), ut11::Is::Not::EqualTo(""));
		});
	}